

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentdelete.cpp
# Opt level: O0

void delete_elements(DuckDB *db,bool *correct,size_t threadnr)

{
  byte bVar1;
  __int_type_conflict1 _Var2;
  pointer pMVar3;
  long in_RDX;
  long in_RSI;
  DuckDB *in_RDI;
  Value new_count;
  size_t element;
  size_t i;
  int64_t start_count;
  Value count;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  Connection con;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffda8;
  byte in_stack_fffffffffffffdaf;
  allocator *in_stack_fffffffffffffdd8;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [8];
  long local_1c0;
  Value local_1b8 [71];
  allocator local_171;
  string local_170 [32];
  string local_150 [8];
  string local_148 [32];
  string local_128 [32];
  string local_108 [8];
  long local_100;
  ulong local_f8;
  long local_f0;
  Value local_e8 [71];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [31];
  allocator local_61;
  string local_60 [32];
  string local_40 [8];
  Connection local_38 [32];
  long local_18;
  long local_10;
  
  *(undefined1 *)(in_RSI + in_RDX) = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  duckdb::Connection::Connection(local_38,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"BEGIN TRANSACTION;",&local_61);
  duckdb::Connection::Query(local_40);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x784b11);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"SELECT COUNT(*) FROM integers",&local_a1);
  duckdb::Connection::Query(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pMVar3 = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)in_stack_fffffffffffffda0);
  duckdb::MaterializedQueryResult::GetValue((ulong)local_e8,(ulong)pMVar3);
  local_f0 = duckdb::Value::GetValue<long>();
  for (local_f8 = 0; local_f8 < 100; local_f8 = local_f8 + 1) {
    local_100 = local_18 * 100 + local_f8;
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdd8);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffda0);
    duckdb::Connection::Query(local_108);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffda0);
    bVar1 = duckdb::BaseQueryResult::HasError();
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x784ca0);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    if ((bVar1 & 1) != 0) {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
    in_stack_fffffffffffffdd8 = &local_171;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_170,"SELECT COUNT(*) FROM integers",in_stack_fffffffffffffdd8);
    duckdb::Connection::Query(local_150);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator=((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x784e85);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)in_stack_fffffffffffffda0);
    bVar1 = duckdb::BaseQueryResult::HasError();
    if ((bVar1 & 1) == 0) {
      pMVar3 = duckdb::
               unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                             *)in_stack_fffffffffffffda0);
      duckdb::MaterializedQueryResult::GetValue((ulong)local_1b8,(ulong)pMVar3);
      local_1c0 = ~local_f8 + local_f0;
      in_stack_fffffffffffffdaf = duckdb::Value::operator!=(local_1b8,&local_1c0);
      if ((in_stack_fffffffffffffdaf & 1) != 0) {
        *(undefined1 *)(local_10 + local_18) = 0;
      }
      duckdb::Value::operator=(local_e8,local_1b8);
      duckdb::Value::~Value(local_1b8);
    }
    else {
      *(undefined1 *)(local_10 + local_18) = 0;
    }
  }
  std::__atomic_base<int>::operator++(&delete_finished_threads.super___atomic_base<int>,0);
  do {
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
  } while (_Var2 != 10);
  paVar4 = &local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"COMMIT;",paVar4);
  duckdb::Connection::Query(local_1c8);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x785090);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  duckdb::Value::~Value(local_e8);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x7850c1);
  duckdb::Connection::~Connection(local_38);
  return;
}

Assistant:

static void delete_elements(DuckDB *db, bool *correct, size_t threadnr) {
	correct[threadnr] = true;
	Connection con(*db);
	// initial count
	con.Query("BEGIN TRANSACTION;");
	auto result = con.Query("SELECT COUNT(*) FROM integers");
	Value count = result->GetValue(0, 0);
	auto start_count = count.GetValue<int64_t>();

	for (size_t i = 0; i < CONCURRENT_DELETE_INSERT_ELEMENTS; i++) {
		// count should decrease by one for every delete we do
		auto element = CONCURRENT_DELETE_INSERT_ELEMENTS * threadnr + i;
		if (con.Query("DELETE FROM integers WHERE i=" + to_string(element))->HasError()) {
			correct[threadnr] = false;
		}
		result = con.Query("SELECT COUNT(*) FROM integers");
		if (result->HasError()) {
			correct[threadnr] = false;
		} else {
			Value new_count = result->GetValue(0, 0);
			if (new_count != start_count - (i + 1)) {
				correct[threadnr] = false;
			}
			count = new_count;
		}
	}
	delete_finished_threads++;
	while (delete_finished_threads != CONCURRENT_DELETE_THREAD_COUNT)
		;
	con.Query("COMMIT;");
}